

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeSet * __thiscall icu_63::UnicodeSet::addAll(UnicodeSet *this,UnicodeString *s)

{
  short sVar1;
  uint c;
  int iVar2;
  int32_t offset;
  
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (0 < iVar2) {
    offset = 0;
    do {
      c = UnicodeString::char32At(s,offset);
      add(this,c);
      sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (s->fUnion).fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      offset = (offset - (uint)(c < 0x10000)) + 2;
    } while (offset < iVar2);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::addAll(const UnicodeString& s) {
    UChar32 cp;
    for (int32_t i = 0; i < s.length(); i += U16_LENGTH(cp)) {
        cp = s.char32At(i);
        add(cp);
    }
    return *this;
}